

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O1

void on_link_flow_on(void *context)

{
  ASYNC_OPERATION_HANDLE pAVar1;
  ASYNC_OPERATION_CANCEL_HANDLER_FUNC p_Var2;
  SEND_ONE_MESSAGE_RESULT SVar3;
  LOGGER_LOG p_Var4;
  MESSAGE_SENDER_HANDLE message_sender;
  size_t index;
  
  if (*(long *)((long)context + 8) != 0) {
    index = 0;
    do {
      pAVar1 = *(ASYNC_OPERATION_HANDLE *)(*(long *)((long)context + 0x10) + index * 8);
      if (*(int *)&pAVar1[5].async_operation_cancel_handler == 0) {
        SVar3 = send_one_message((MESSAGE_SENDER_INSTANCE *)context,pAVar1,
                                 (MESSAGE_HANDLE)pAVar1[1].async_operation_cancel_handler);
        if (SVar3 != SEND_ONE_MESSAGE_OK) {
          if (SVar3 == SEND_ONE_MESSAGE_ERROR) {
            p_Var2 = pAVar1[2].async_operation_cancel_handler;
            pAVar1 = (ASYNC_OPERATION_HANDLE)pAVar1[3].async_operation_cancel_handler;
            remove_pending_message_by_index((MESSAGE_SENDER_HANDLE)context,index);
            if (p_Var2 != (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
              (*p_Var2)(pAVar1);
            }
            index = *(size_t *)((long)context + 8);
          }
          else if (SVar3 == SEND_ONE_MESSAGE_BUSY) {
            index = *(long *)((long)context + 8) + 1;
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                        ,"send_all_pending_messages",0x28e,1,"Invalid send one message result");
            }
          }
        }
        index = index - 1;
      }
      index = index + 1;
    } while (index < *(ulong *)((long)context + 8));
  }
  return;
}

Assistant:

static void send_all_pending_messages(MESSAGE_SENDER_HANDLE message_sender)
{
    size_t i;

    for (i = 0; i < message_sender->message_count; i++)
    {
        MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, message_sender->messages[i]);
        if (message_with_callback->message_send_state == MESSAGE_SEND_STATE_NOT_SENT)
        {
            switch (send_one_message(message_sender, message_sender->messages[i], message_with_callback->message))
            {
            default:
                LogError("Invalid send one message result");
                break;

            case SEND_ONE_MESSAGE_ERROR:
            {
                ON_MESSAGE_SEND_COMPLETE on_message_send_complete = message_with_callback->on_message_send_complete;
                void* context = message_with_callback->context;
                remove_pending_message_by_index(message_sender, i);

                if (on_message_send_complete != NULL)
                {
                    on_message_send_complete(context, MESSAGE_SEND_ERROR, NULL);
                }

                i = message_sender->message_count;
                break;
            }
            case SEND_ONE_MESSAGE_BUSY:
                i = message_sender->message_count + 1;
                break;

            case SEND_ONE_MESSAGE_OK:
                break;
            }

            i--;
        }
    }
}